

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

void __thiscall iDynTree::KinDynComputations::computeBiasAccFwdKinematics(KinDynComputations *this)

{
  byte bVar1;
  VectorFixSize<6U> *in_RDI;
  bool ok;
  Rotation *in_stack_00000088;
  Twist *in_stack_00000090;
  Vector6 *in_stack_00000098;
  Vector6 zeroBaseAcc;
  EigenBase<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffef8;
  Matrix<double,_6,_1,_0,_6,_1> *in_stack_ffffffffffffff00;
  SpatialAcc local_d8;
  Matrix<double,_6,_1,_0,_6,_1> *in_stack_ffffffffffffff78;
  SpatialMotionVector *in_stack_ffffffffffffff80;
  Transform *in_stack_ffffffffffffffd0;
  Vector6 *in_stack_ffffffffffffffd8;
  
  if ((*(byte *)((long)in_RDI->m_data[1] + 0x430) & 1) == 0) {
    VectorFixSize<6U>::VectorFixSize((VectorFixSize<6U> *)&stack0xffffffffffffffc8);
    VectorFixSize<6U>::zero((VectorFixSize<6U> *)&stack0xffffffffffffffc8);
    if (*(int *)((long)in_RDI->m_data[1] + 4) == 1) {
      toEigen<6U>(in_RDI);
      Eigen::Matrix<double,6,1,0,6,1>::
      Matrix<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>,0,Eigen::Stride<0,0>>>
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      fromEigen(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else if (*(int *)((long)in_RDI->m_data[1] + 4) == 0) {
      iDynTree::FreeFloatingPos::worldBasePos();
      convertInertialAccelerationToBodyFixedAcceleration
                (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      iDynTree::SpatialAcc::operator=
                ((SpatialAcc *)((long)in_RDI->m_data[1] + 0x438),
                 (SpatialAcc *)&stack0xffffffffffffff58);
    }
    else {
      iDynTree::FreeFloatingVel::baseVel();
      iDynTree::FreeFloatingPos::worldBasePos();
      iDynTree::Transform::getRotation();
      convertMixedAccelerationToBodyFixedAcceleration
                (in_stack_00000098,in_stack_00000090,in_stack_00000088);
      iDynTree::SpatialAcc::operator=((SpatialAcc *)((long)in_RDI->m_data[1] + 0x438),&local_d8);
    }
    bVar1 = iDynTree::ForwardBiasAccKinematics
                      ((Model *)((long)in_RDI->m_data[1] + 8),
                       (Traversal *)((long)in_RDI->m_data[1] + 0x138),
                       (FreeFloatingPos *)((long)in_RDI->m_data[1] + 0x1b0),
                       (FreeFloatingVel *)((long)in_RDI->m_data[1] + 0x238),
                       (SpatialAcc *)((long)in_RDI->m_data[1] + 0x438),
                       (LinkVelArray *)((long)in_RDI->m_data[1] + 0x310),
                       (LinkAccArray *)((long)in_RDI->m_data[1] + 0x468));
    iDynTree::reportErrorIf
              ((bool)((bVar1 & 1 ^ 0xff) & 1),"KinDynComputations::computeBiasAccFwdKinematics",
               "Error in computing the bias accelerations.");
    *(byte *)((long)in_RDI->m_data[1] + 0x430) = bVar1 & 1;
  }
  return;
}

Assistant:

void KinDynComputations::computeBiasAccFwdKinematics()
{
    if( this->pimpl->m_areBiasAccelerationsUpdated )
    {
        return;
    }

    // Convert input base acceleration, that in this case is zero
    Vector6 zeroBaseAcc;
    zeroBaseAcc.zero();
    if( pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION )
    {
        fromEigen(pimpl->m_baseBiasAcc,toEigen(zeroBaseAcc));
    }
    else if( pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION )
    {
        pimpl->m_baseBiasAcc = convertInertialAccelerationToBodyFixedAcceleration(zeroBaseAcc, pimpl->m_pos.worldBasePos());
    }
    else
    {
        assert(pimpl->m_frameVelRepr == MIXED_REPRESENTATION);
        pimpl->m_baseBiasAcc = convertMixedAccelerationToBodyFixedAcceleration(zeroBaseAcc,
                                                                               pimpl->m_vel.baseVel(),
                                                                               pimpl->m_pos.worldBasePos().getRotation());
    }

    // Compute body-fixed bias accelerations
    bool ok = ForwardBiasAccKinematics(pimpl->m_robot_model,
                                       pimpl->m_traversal,
                                       pimpl->m_pos,
                                       pimpl->m_vel,
                                       pimpl->m_baseBiasAcc,
                                       pimpl->m_linkVel,
                                       pimpl->m_linkBiasAcc);

    reportErrorIf(!ok,"KinDynComputations::computeBiasAccFwdKinematics","Error in computing the bias accelerations.");

    this->pimpl->m_areBiasAccelerationsUpdated = ok;
}